

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastEvS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  ushort *puVar4;
  ulong uVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar3 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  puVar7 = *(uint **)((long)&table->has_bits_offset +
                     ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  uVar8 = (ulong)ptr[1];
  if ((long)uVar8 < 0) {
    uVar5 = (long)ptr[2] << 7 | 0x7f;
    if ((long)uVar5 < 0) {
      uVar9 = (long)ptr[3] << 0xe | 0x3fff;
      if ((long)uVar9 < 0) {
        uVar5 = uVar5 & ((long)ptr[4] << 0x15 | 0x1fffffU);
        if ((long)uVar5 < 0) {
          uVar9 = uVar9 & ((long)ptr[5] << 0x1c | 0xfffffffU);
          if ((long)uVar9 < 0) {
            uVar5 = uVar5 & ((long)ptr[6] << 0x23 | 0x7ffffffffU);
            if ((long)uVar5 < 0) {
              uVar9 = uVar9 & ((long)ptr[7] << 0x2a | 0x3ffffffffffU);
              if ((long)uVar9 < 0) {
                uVar5 = uVar5 & ((long)ptr[8] << 0x31 | 0x1ffffffffffffU);
                if ((long)uVar5 < 0) {
                  uVar9 = uVar9 & ((ulong)(byte)ptr[9] << 0x38 | 0xffffffffffffff);
                  if ((long)uVar9 < 0) {
                    puVar4 = (ushort *)(ptr + 0xb);
                    if ((ptr[10] != '\x01') && (ptr[10] < '\0')) {
                      pcVar3 = Error(msg,ptr,ctx,data,table,hasbits);
                      return pcVar3;
                    }
                  }
                  else {
                    puVar4 = (ushort *)(ptr + 10);
                  }
                }
                else {
                  puVar4 = (ushort *)(ptr + 9);
                }
              }
              else {
                puVar4 = (ushort *)(ptr + 8);
              }
            }
            else {
              puVar4 = (ushort *)(ptr + 7);
            }
          }
          else {
            puVar4 = (ushort *)(ptr + 6);
          }
        }
        else {
          puVar4 = (ushort *)(ptr + 5);
        }
      }
      else {
        puVar4 = (ushort *)(ptr + 4);
      }
      uVar5 = uVar5 & uVar9;
    }
    else {
      puVar4 = (ushort *)(ptr + 3);
    }
    uVar8 = uVar8 & uVar5;
  }
  else {
    puVar4 = (ushort *)(ptr + 2);
  }
  uVar9 = (ulong)(*puVar7 >> 0x10);
  uVar6 = (uint)uVar8;
  uVar8 = (long)(int)uVar6 - (long)(short)*puVar7;
  uVar5 = uVar8 - uVar9;
  if (uVar9 <= uVar8) {
    uVar1 = puVar7[1];
    if (uVar5 < (uVar1 & 0xffff)) {
      if ((puVar7[(uVar5 >> 5) + 2] >> ((uint)uVar5 & 0x1f) & 1) == 0) {
LAB_001518aa:
        pcVar3 = FastUnknownEnumFallback(msg,ptr,ctx,data,table,hasbits);
        return pcVar3;
      }
    }
    else {
      uVar8 = 0;
      do {
        if (uVar1 >> 0x10 <= uVar8) goto LAB_001518aa;
        uVar2 = *(uint *)((long)puVar7 + uVar8 * 4 + (ulong)(uVar1 >> 3 & 0x1ffc) + 8);
        uVar8 = (uVar8 * 2 - (ulong)((int)uVar6 < (int)uVar2)) + 2;
      } while (uVar2 != uVar6);
    }
  }
  puVar7 = (uint *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)puVar7 & 3) == 0) {
    *puVar7 = uVar6;
    if (puVar4 < (ctx->super_EpsCopyInputStream).limit_end_) {
      uVar6 = (uint)table->fast_idx_mask & (uint)*puVar4;
      if ((uVar6 & 7) == 0) {
        uVar8 = (ulong)(uVar6 & 0xfffffff8);
        pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + uVar8))
                                   (msg,puVar4,ctx,
                                    (ulong)*puVar4 ^ *(ulong *)(&table[1].fast_idx_mask + uVar8 * 2)
                                   );
        return pcVar3;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
    if ((ulong)table->has_bits_offset != 0) {
      puVar7 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar7 & 3) != 0) goto LAB_001518bc;
      *puVar7 = *puVar7 | (uint)hasbits | (uint)(1L << ((ulong)data.field_0 >> 0x10 & 0x3f));
    }
    return (char *)puVar4;
  }
LAB_001518bc:
  AlignFail(puVar7);
}

Assistant:

inline PROTOBUF_ALWAYS_INLINE const char* TcParser::SingularEnum(
    PROTOBUF_TC_PARAM_DECL) {
  if (PROTOBUF_PREDICT_FALSE(data.coded_tag<TagType>() != 0)) {
    PROTOBUF_MUSTTAIL return MiniParse(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  const TcParseTableBase::FieldAux aux = *table->field_aux(data.aux_idx());
  PrefetchEnumData(xform_val, aux);
  const char* ptr2 = ptr;  // Save for unknown enum case
  ptr += sizeof(TagType);  // Consume tag
  uint64_t tmp;
  ptr = ParseVarint(ptr, &tmp);
  if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) {
    PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
  }
  if (PROTOBUF_PREDICT_FALSE(
          !EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux))) {
    ptr = ptr2;
    PROTOBUF_MUSTTAIL return FastUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
  }
  hasbits |= (uint64_t{1} << data.hasbit_idx());
  RefAt<int32_t>(msg, data.offset()) = tmp;
  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}